

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

RandomDataProviderProvider * getRandomDataProviderProvider(void)

{
  int iVar1;
  
  if (getRandomDataProviderProvider()::rdpp == '\0') {
    iVar1 = __cxa_guard_acquire(&getRandomDataProviderProvider()::rdpp);
    if (iVar1 != 0) {
      anon_unknown.dwarf_68281a::RandomDataProviderProvider::RandomDataProviderProvider
                (&getRandomDataProviderProvider::rdpp);
      __cxa_guard_release(&getRandomDataProviderProvider()::rdpp);
    }
  }
  return &getRandomDataProviderProvider::rdpp;
}

Assistant:

static RandomDataProviderProvider*
getRandomDataProviderProvider()
{
    // Thread-safe static initializer
    static RandomDataProviderProvider rdpp;
    return &rdpp;
}